

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int update_library_got(link_map *map,hash_table_t *bindingtable)

{
  Elf64_Addr EVar1;
  FILE *pFVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Elf64_Sym *pEVar6;
  ulong uVar7;
  bool bVar8;
  char *local_1e8;
  char *local_1e0;
  char *local_1d0;
  char *local_1b0;
  char *local_1a8;
  char *local_198;
  char *local_178;
  char *local_170;
  char *local_160;
  char *symname_3;
  Elf64_Sym *sym_3;
  unsigned_long symidx_3;
  Elf64_Addr offset_4;
  char *symname_2;
  Elf64_Sym *sym_2;
  unsigned_long symidx_2;
  Elf64_Addr offset_3;
  Elf64_Rel *jmp_rel;
  char *symname_1;
  Elf64_Sym *sym_1;
  unsigned_long symidx_1;
  Elf64_Addr offset_2;
  char *symname;
  Elf64_Sym *sym;
  unsigned_long symidx;
  Elf64_Addr offset_1;
  Elf64_Rela *jmp_rela;
  Elf64_Addr offset;
  uint rel_esz;
  uint jmprel_count;
  uint jmprel_size;
  uint rela_esz;
  uint rela_count;
  uint rela_size;
  uint i;
  uint is_rela;
  uint rel_count;
  uint rel_size;
  char *strtab;
  Elf64_Half *versym;
  Elf64_Addr got;
  Elf64_Addr elf_hash;
  Elf64_Addr gnu_hash;
  Elf64_Sym *symtab;
  Elf64_Addr jmprel;
  Elf64_Rel *rel;
  Elf64_Rela *rela;
  Elf64_Dyn *dentry;
  Elf64_Dyn *dynsec;
  library_t *lib;
  hash_table_t *bindingtable_local;
  link_map *map_local;
  
  dynsec = (Elf64_Dyn *)get_library(map);
  pFVar2 = _stderr;
  if ((library_t *)dynsec == (library_t *)0x0) {
    if (2 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_160 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                          ,0x2f);
      if (local_160 == (char *)0x0) {
        local_160 = "";
      }
      if (map->l_name == (char *)0x0) {
        local_170 = "[NULL]";
      }
      else {
        if (*map->l_name == '\0') {
          local_178 = "[EMPTY]";
        }
        else {
          local_178 = map->l_name;
        }
        local_170 = local_178;
      }
      fprintf(pFVar2,"[%d/%d][%s:%u] - Creating new library object for %s\n",(ulong)uVar3,
              (ulong)uVar4,local_160 + 1,0x16e,local_170);
    }
    dynsec = (Elf64_Dyn *)add_library(map);
  }
  iVar5 = (*libraryFilterFunc)(map);
  pFVar2 = _stderr;
  if (iVar5 == 0) {
    if (2 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_198 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                          ,0x2f);
      if (local_198 == (char *)0x0) {
        local_198 = "";
      }
      if (map->l_name == (char *)0x0) {
        local_1a8 = "[NULL]";
      }
      else {
        if (*map->l_name == '\0') {
          local_1b0 = "[EMPTY]";
        }
        else {
          local_1b0 = map->l_name;
        }
        local_1a8 = local_1b0;
      }
      fprintf(pFVar2,"[%d/%d][%s:%u] - Skipping library %s due to libraryFilterFunc\n",(ulong)uVar3,
              (ulong)uVar4,local_198 + 1,0x174,local_1a8);
    }
    map_local._4_4_ = 0;
  }
  else if (*(uint *)&dynsec[1].d_un == current_generation) {
    if (1 < debug_level) {
      uVar3 = gotcha_gettid();
      uVar4 = getpid();
      local_1d0 = strrchr("/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/ext/gotcha/src/gotcha.c"
                          ,0x2f);
      if (local_1d0 == (char *)0x0) {
        local_1d0 = "";
      }
      if (map->l_name == (char *)0x0) {
        local_1e0 = "[NULL]";
      }
      else {
        if (*map->l_name == '\0') {
          local_1e8 = "[EMPTY]";
        }
        else {
          local_1e8 = map->l_name;
        }
        local_1e0 = local_1e8;
      }
      fprintf(pFVar2,"[%d/%d][%s:%u] - Library %s is already up-to-date.  Skipping GOT rewriting\n",
              (ulong)uVar3,(ulong)uVar4,local_1d0 + 1,0x17b,local_1e0);
    }
    map_local._4_4_ = 0;
  }
  else {
    if ((dynsec[1].d_un.d_val & 0x100000000) == 0) {
      mark_got_writable(map);
      *(uint *)((long)&dynsec[1].d_un + 4) = *(uint *)((long)&dynsec[1].d_un + 4) | 1;
    }
    rel = (Elf64_Rel *)0x0;
    jmprel = 0;
    symtab = (Elf64_Sym *)0x0;
    gnu_hash = 0;
    _rel_count = 0;
    is_rela = 0;
    i = 0;
    bVar8 = false;
    rela_esz = 0;
    jmprel_size = 0;
    jmprel_count = 1;
    rel_esz = 0;
    offset._0_4_ = 1;
    rela = (Elf64_Rela *)map->l_ld;
    if (rela == (Elf64_Rela *)0x0) {
      map_local._4_4_ = -1;
    }
    else {
      for (; rela->r_offset != 0; rela = (Elf64_Rela *)&rela->r_addend) {
        EVar1 = rela->r_offset;
        if (EVar1 == 2) {
          rel_esz = (uint)rela->r_info;
        }
        else if ((EVar1 != 3) && (EVar1 != 4)) {
          if (EVar1 == 5) {
            _rel_count = rela->r_info;
          }
          else if (EVar1 == 6) {
            gnu_hash = rela->r_info;
          }
          else if (EVar1 == 7) {
            rel = (Elf64_Rel *)rela->r_info;
          }
          else if (EVar1 == 8) {
            rela_esz = (uint)rela->r_info;
          }
          else if (EVar1 == 9) {
            jmprel_count = (uint)rela->r_info;
          }
          else if (EVar1 == 0x11) {
            jmprel = rela->r_info;
          }
          else if (EVar1 == 0x12) {
            is_rela = (uint)rela->r_info;
          }
          else if (EVar1 == 0x13) {
            offset._0_4_ = (uint)rela->r_info;
          }
          else if (EVar1 == 0x14) {
            bVar8 = rela->r_info == 7;
          }
          else if (EVar1 == 0x17) {
            symtab = (Elf64_Sym *)rela->r_info;
          }
        }
      }
      uVar7 = 0x10;
      if (bVar8) {
        uVar7 = 0x18;
      }
      uVar3 = (uint)(rel_esz / uVar7);
      if (jmprel != 0) {
        i = is_rela / (uint)offset;
      }
      if (rel != (Elf64_Rel *)0x0) {
        jmprel_size = rela_esz / jmprel_count;
      }
      if (bVar8) {
        for (rela_count = 0; rela_count < uVar3; rela_count = rela_count + 1) {
          pEVar6 = symtab + rela_count;
          EVar1._0_4_ = pEVar6->st_name;
          EVar1._4_1_ = pEVar6->st_info;
          EVar1._5_1_ = pEVar6->st_other;
          EVar1._6_2_ = pEVar6->st_shndx;
          pEVar6 = (Elf64_Sym *)(gnu_hash + (symtab[rela_count].st_value >> 0x20) * 0x18);
          update_lib_bindings(pEVar6,(char *)(_rel_count + pEVar6->st_name),EVar1,map,bindingtable);
        }
        if (rel != (Elf64_Rel *)0x0) {
          for (rela_count = 0; rela_count < jmprel_size; rela_count = rela_count + 1) {
            pEVar6 = (Elf64_Sym *)
                     (gnu_hash +
                     (*(ulong *)((long)rel + (ulong)rela_count * 0x18 + 8) >> 0x20) * 0x18);
            update_lib_bindings(pEVar6,(char *)(_rel_count + pEVar6->st_name),
                                *(Elf64_Addr *)((long)rel + (ulong)rela_count * 0x18),map,
                                bindingtable);
          }
        }
      }
      else {
        for (rela_count = 0; rela_count < uVar3; rela_count = rela_count + 1) {
          pEVar6 = (Elf64_Sym *)
                   (gnu_hash + ((&symtab->st_value)[(ulong)rela_count * 2] >> 0x20) * 0x18);
          update_lib_bindings(pEVar6,(char *)(_rel_count + pEVar6->st_name),
                              *(Elf64_Addr *)(&symtab->st_name + (ulong)rela_count * 4),map,
                              bindingtable);
        }
        if (jmprel != 0) {
          for (rela_count = 0; rela_count < i; rela_count = rela_count + 1) {
            pEVar6 = (Elf64_Sym *)
                     (gnu_hash + (*(ulong *)(jmprel + (ulong)rela_count * 0x10 + 8) >> 0x20) * 0x18)
            ;
            update_lib_bindings(pEVar6,(char *)(_rel_count + pEVar6->st_name),
                                *(Elf64_Addr *)(jmprel + (ulong)rela_count * 0x10),map,bindingtable)
            ;
          }
        }
      }
      *(uint *)&dynsec[1].d_un = current_generation;
      map_local._4_4_ = 0;
    }
  }
  return map_local._4_4_;
}

Assistant:

static int update_library_got(struct link_map *map,
                              hash_table_t *bindingtable) {
  struct library_t *lib = get_library(map);
  if (!lib) {
    debug_printf(3, "Creating new library object for %s\n", LIB_NAME(map));
    lib = add_library(map);
  }

  if (!libraryFilterFunc(map)) {
    debug_printf(3, "Skipping library %s due to libraryFilterFunc\n",
                 LIB_NAME(map));
    return 0;
  }

  if (lib->generation == current_generation) {
    debug_printf(2,
                 "Library %s is already up-to-date.  Skipping GOT rewriting\n",
                 LIB_NAME(map));
    return 0;
  }

  if (!(lib->flags & LIB_GOT_MARKED_WRITEABLE)) {
    mark_got_writable(map);
    lib->flags |= LIB_GOT_MARKED_WRITEABLE;
  }

  FOR_EACH_PLTREL(map, update_lib_bindings, map, bindingtable);
  lib->generation = current_generation;
  return 0;
}